

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O0

void __thiscall
QParallelAnimationGroup::updateCurrentTime(QParallelAnimationGroup *this,int currentTime)

{
  bool bVar1;
  parameter_type pVar2;
  int iVar3;
  State SVar4;
  QParallelAnimationGroupPrivate *this_00;
  const_iterator o;
  QAbstractAnimation **ppQVar5;
  int in_ESI;
  QAbstractAnimation *in_RDI;
  long in_FS_OFFSET;
  int dura_1;
  QAbstractAnimation *animation_2;
  QAbstractAnimation *animation_1;
  QAbstractAnimation *animation;
  int dura;
  QParallelAnimationGroupPrivate *d;
  AnimationListConstIt cend_2;
  AnimationListConstIt it_2;
  AnimationListConstIt cend_1;
  AnimationListConstIt it_1;
  AnimationListConstIt cend;
  AnimationListConstIt it;
  QAbstractAnimation *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  State in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  QParallelAnimationGroupPrivate *this_01;
  undefined8 in_stack_ffffffffffffffb8;
  const_iterator local_40;
  QAbstractAnimation **local_38;
  const_iterator local_30;
  const_iterator local_28;
  QAbstractAnimation **local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QParallelAnimationGroup *)0x67cc94);
  bVar1 = QList<QAbstractAnimation_*>::isEmpty((QList<QAbstractAnimation_*> *)0x67ccaa);
  if (!bVar1) {
    pVar2 = ::QObjectCompatProperty::operator_cast_to_int
                      ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                        *)0x67ccc6);
    if (this_00->lastLoop < pVar2) {
      iVar3 = (*(in_RDI->super_QObject)._vptr_QObject[0xc])();
      if (0 < iVar3) {
        local_10.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
        local_10 = QList<QAbstractAnimation_*>::constBegin
                             ((QList<QAbstractAnimation_*> *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        local_18.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
        local_18 = QList<QAbstractAnimation_*>::constEnd
                             ((QList<QAbstractAnimation_*> *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        while( true ) {
          local_20 = local_18.i;
          bVar1 = QList<QAbstractAnimation_*>::const_iterator::operator!=(&local_10,local_18);
          if (!bVar1) break;
          QList<QAbstractAnimation_*>::const_iterator::operator*(&local_10);
          SVar4 = QAbstractAnimation::state
                            ((QAbstractAnimation *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
          if (SVar4 != Stopped) {
            QAbstractAnimation::setCurrentTime
                      ((QAbstractAnimation *)this_00,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20)
                      );
          }
          QList<QAbstractAnimation_*>::const_iterator::operator++(&local_10);
        }
      }
    }
    else {
      pVar2 = ::QObjectCompatProperty::operator_cast_to_int
                        ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                          *)0x67cdc7);
      if (pVar2 < this_00->lastLoop) {
        local_28.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
        local_28 = QList<QAbstractAnimation_*>::constBegin
                             ((QList<QAbstractAnimation_*> *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        local_30.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
        local_30 = QList<QAbstractAnimation_*>::constEnd
                             ((QList<QAbstractAnimation_*> *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        while( true ) {
          local_38 = local_30.i;
          bVar1 = QList<QAbstractAnimation_*>::const_iterator::operator!=(&local_28,local_30);
          if (!bVar1) break;
          QList<QAbstractAnimation_*>::const_iterator::operator*(&local_28);
          QParallelAnimationGroupPrivate::applyGroupState
                    ((QParallelAnimationGroupPrivate *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
          QAbstractAnimation::setCurrentTime
                    ((QAbstractAnimation *)this_00,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
          QAbstractAnimation::stop
                    ((QAbstractAnimation *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
          QList<QAbstractAnimation_*>::const_iterator::operator++(&local_28);
        }
      }
    }
    local_40.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = QList<QAbstractAnimation_*>::constBegin
                         ((QList<QAbstractAnimation_*> *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    o = QList<QAbstractAnimation_*>::constEnd
                  ((QList<QAbstractAnimation_*> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    while (bVar1 = QList<QAbstractAnimation_*>::const_iterator::operator!=(&local_40,o), bVar1) {
      ppQVar5 = QList<QAbstractAnimation_*>::const_iterator::operator*(&local_40);
      this_01 = (QParallelAnimationGroupPrivate *)*ppQVar5;
      iVar3 = QAbstractAnimation::totalDuration(in_RDI);
      pVar2 = ::QObjectCompatProperty::operator_cast_to_int
                        ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                          *)0x67cf28);
      if ((this_00->lastLoop < pVar2) ||
         (bVar1 = QParallelAnimationGroupPrivate::shouldAnimationStart
                            (this_01,(QAbstractAnimation *)CONCAT44(iVar3,in_stack_ffffffffffffff70)
                             ,SUB81((ulong)in_RDI >> 0x38,0)), bVar1)) {
        QParallelAnimationGroupPrivate::applyGroupState
                  ((QParallelAnimationGroupPrivate *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
      }
      in_stack_ffffffffffffff64 =
           QAbstractAnimation::state
                     ((QAbstractAnimation *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      SVar4 = QAbstractAnimation::state
                        ((QAbstractAnimation *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      if (((in_stack_ffffffffffffff64 == SVar4) &&
          (QAbstractAnimation::setCurrentTime
                     ((QAbstractAnimation *)this_00,(int)((ulong)o.i >> 0x20)), 0 < iVar3)) &&
         (iVar3 < in_ESI)) {
        QAbstractAnimation::stop
                  ((QAbstractAnimation *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      QList<QAbstractAnimation_*>::const_iterator::operator++(&local_40);
    }
    pVar2 = ::QObjectCompatProperty::operator_cast_to_int
                      ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                        *)0x67cfe0);
    this_00->lastLoop = pVar2;
    this_00->lastCurrentTime = in_ESI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QParallelAnimationGroup::updateCurrentTime(int currentTime)
{
    Q_D(QParallelAnimationGroup);
    if (d->animations.isEmpty())
        return;

    if (d->currentLoop > d->lastLoop) {
        // simulate completion of the loop
        int dura = duration();
        if (dura > 0) {
            for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it) {
                QAbstractAnimation *animation = (*it);
                if (animation->state() != QAbstractAnimation::Stopped)
                    animation->setCurrentTime(dura);   // will stop
            }
        }
    } else if (d->currentLoop < d->lastLoop) {
        // simulate completion of the loop seeking backwards
        for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it) {
            QAbstractAnimation *animation = *it;
            //we need to make sure the animation is in the right state
            //and then rewind it
            d->applyGroupState(animation);
            animation->setCurrentTime(0);
            animation->stop();
        }
    }

#ifdef QANIMATION_DEBUG
    qDebug("QParallellAnimationGroup %5d: setCurrentTime(%d), loop:%d, last:%d, timeFwd:%d, lastcurrent:%d, %d",
        __LINE__, d->currentTime, d->currentLoop, d->lastLoop, timeFwd, d->lastCurrentTime, state());
#endif
    // finally move into the actual time of the current loop
    for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it) {
        QAbstractAnimation *animation = *it;
        const int dura = animation->totalDuration();
        //if the loopcount is bigger we should always start all animations
        if (d->currentLoop > d->lastLoop
            //if we're at the end of the animation, we need to start it if it wasn't already started in this loop
            //this happens in Backward direction where not all animations are started at the same time
            || d->shouldAnimationStart(animation, d->lastCurrentTime > dura /*startIfAtEnd*/)) {
            d->applyGroupState(animation);
        }

        if (animation->state() == state()) {
            animation->setCurrentTime(currentTime);
            if (dura > 0 && currentTime > dura)
                animation->stop();
        }
    }
    d->lastLoop = d->currentLoop;
    d->lastCurrentTime = currentTime;
}